

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_Subtract(SubtractForm4 Subtract)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar5;
  uint x;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  byte *pbVar10;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  anon_class_8_1_a814987b in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  uint32_t uVar11;
  undefined4 in_stack_fffffffffffffe74;
  uint8_t value;
  value_type vVar12;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffec0;
  size_type sVar13;
  uint32_t *in_stack_fffffffffffffec8;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffed0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffed8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffee0;
  uint32_t local_c0;
  uint32_t local_bc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_88;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *local_70;
  uchar *local_68;
  uchar *local_60;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  code *local_28;
  
  local_28 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffe58.image >> 0x20));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)0x1e41a4);
  local_60 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffe58.image);
  local_68 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffe58.image);
  __first._M_current._4_4_ = in_stack_fffffffffffffe6c;
  __first._M_current._0_4_ = in_stack_fffffffffffffe68;
  __last._M_current._4_4_ = in_stack_fffffffffffffe64;
  __last._M_current._0_4_ = in_stack_fffffffffffffe60;
  local_70 = &local_58;
  local_88 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)std::
                for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,Function_Template::form4_Subtract(void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int))::__0>
                          (__first,__last,in_stack_fffffffffffffe58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e422d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1e4242);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  image_00 = (Image *)0x0;
  this = &local_58;
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  this_00 = &local_a0;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(size_type)image_00);
  vVar12 = *pvVar7;
  this_01 = &local_b8;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_01,(size_type)image_00);
  vVar1 = *pvVar7;
  sVar13 = 1;
  pvVar8 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar13);
  vVar2 = *pvVar7;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar13);
  vVar3 = *pvVar7;
  sVar13 = 2;
  pvVar9 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,2);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar13);
  vVar4 = *pvVar7;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,sVar13);
  uVar11 = local_bc;
  (*local_28)(pvVar6,vVar12,vVar1,pvVar8,vVar2,vVar3,pvVar9,vVar4,*pvVar7,local_bc,local_c0);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_58,2);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_a0,2);
  value = (uint8_t)(*pvVar7 >> 0x18);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b8,2);
  vVar12 = *pvVar7;
  pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
  x = (uint)*pbVar10;
  pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,1);
  if ((int)(uint)*pbVar10 < (int)x) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,1);
  }
  bVar5 = Unit_Test::verifyImage(image_00,x,local_c0,local_bc,vVar12,value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe74,uVar11));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe74,uVar11));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffe74,uVar11));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,uVar11));
  return bVar5;
}

Assistant:

bool form4_Subtract(SubtractForm4 Subtract)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { image.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        Subtract( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], image[2], roiX[2], roiY[2], roiWidth, roiHeight );

        return verifyImage( image[2], roiX[2], roiY[2], roiWidth, roiHeight,
                            static_cast<uint8_t>( intensity[0] > intensity[1] ? intensity[0] - intensity[1] : 0u ) );
    }